

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O2

FT_Error FT_Bitmap_Convert(FT_Library library,FT_Bitmap *source,FT_Bitmap *target,FT_Int alignment)

{
  FT_Memory memory;
  ulong uVar1;
  uint in_EAX;
  byte *__dest;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  uchar *__src;
  bool bVar8;
  ulong uStack_38;
  FT_Error error;
  
  uStack_38 = (ulong)in_EAX;
  if (library == (FT_Library)0x0) {
    error = 0x21;
  }
  else if (target == (FT_Bitmap *)0x0 || source == (FT_Bitmap *)0x0) {
    error = 6;
  }
  else {
    if ((byte)(source->pixel_mode - 1) < 7) {
      if ((target->pitch == 0) && (source->pitch < 0)) {
        bVar7 = 1;
      }
      else {
        bVar7 = (byte)((uint)target->pitch >> 0x1f);
      }
      memory = library->memory;
      uVar2 = source->width;
      FT_Bitmap_Done(library,target);
      target->pixel_mode = '\x02';
      uVar1._0_4_ = source->rows;
      uVar1._4_4_ = source->width;
      target->rows = (undefined4)uVar1;
      target->width = uVar1._4_4_;
      uVar5 = uVar2;
      if ((alignment != 0) && (iVar4 = (int)uVar2 % alignment, iVar4 != 0)) {
        uVar5 = uVar2 - (iVar4 + alignment);
        if (0 < alignment) {
          uVar5 = (uVar2 + alignment) - iVar4;
        }
      }
      __dest = (byte *)ft_mem_qrealloc(memory,(long)(int)uVar5,0,uVar1 & 0xffffffff,(void *)0x0,
                                       &error);
      target->buffer = __dest;
      if (error != 0) {
        return error;
      }
      uVar2 = -uVar5;
      if (bVar7 == 0) {
        uVar2 = uVar5;
      }
      target->pitch = uVar2;
    }
    else {
      uStack_38 = CONCAT44(6,in_EAX);
      __dest = target->buffer;
    }
    __src = source->buffer;
    if (source->pitch < 0) {
      __src = __src + -(long)(int)((source->rows - 1) * source->pitch);
    }
    if (target->pitch < 0) {
      __dest = __dest + -(long)(int)((target->rows - 1) * target->pitch);
    }
    switch(source->pixel_mode) {
    case '\x01':
      target->num_grays = 2;
      uVar2 = source->rows;
      while (bVar8 = uVar2 != 0, uVar2 = uVar2 - 1, bVar8) {
        uVar5 = source->width;
        pbVar3 = __dest;
        for (lVar6 = 0; uVar5 >> 3 != (uint)lVar6; lVar6 = lVar6 + 1) {
          bVar7 = __src[lVar6];
          *pbVar3 = bVar7 >> 7;
          pbVar3[1] = bVar7 >> 6 & 1;
          pbVar3[2] = bVar7 >> 5 & 1;
          pbVar3[3] = bVar7 >> 4 & 1;
          pbVar3[4] = bVar7 >> 3 & 1;
          pbVar3[5] = bVar7 >> 2 & 1;
          pbVar3[6] = bVar7 >> 1 & 1;
          pbVar3[7] = bVar7 & 1;
          pbVar3 = pbVar3 + 8;
        }
        uVar5 = source->width;
        if ((uVar5 & 7) != 0) {
          bVar7 = __src[lVar6];
          for (lVar6 = 0; (uVar5 & 7) != (uint)lVar6; lVar6 = lVar6 + 1) {
            pbVar3[lVar6] = bVar7 >> 7;
            bVar7 = bVar7 * '\x02';
          }
        }
        __src = __src + source->pitch;
        __dest = __dest + target->pitch;
      }
      break;
    case '\x02':
    case '\x05':
    case '\x06':
      uVar2 = source->width;
      target->num_grays = 0x100;
      uVar5 = source->rows;
      while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
        memcpy(__dest,__src,(ulong)uVar2);
        __src = __src + source->pitch;
        __dest = __dest + target->pitch;
      }
      break;
    case '\x03':
      target->num_grays = 4;
      uVar2 = source->rows;
      while (bVar8 = uVar2 != 0, uVar2 = uVar2 - 1, bVar8) {
        uVar5 = source->width;
        pbVar3 = __dest;
        for (lVar6 = 0; uVar5 >> 2 != (uint)lVar6; lVar6 = lVar6 + 1) {
          bVar7 = __src[lVar6];
          *pbVar3 = bVar7 >> 6;
          pbVar3[1] = bVar7 >> 4 & 3;
          pbVar3[2] = bVar7 >> 2 & 3;
          pbVar3[3] = bVar7 & 3;
          pbVar3 = pbVar3 + 4;
        }
        uVar5 = source->width;
        if ((uVar5 & 3) != 0) {
          bVar7 = __src[lVar6];
          for (lVar6 = 0; (uVar5 & 3) != (uint)lVar6; lVar6 = lVar6 + 1) {
            pbVar3[lVar6] = bVar7 >> 6;
            bVar7 = bVar7 << 2;
          }
        }
        __src = __src + source->pitch;
        __dest = __dest + target->pitch;
      }
      break;
    case '\x04':
      target->num_grays = 0x10;
      uVar2 = source->rows;
      while (bVar8 = uVar2 != 0, uVar2 = uVar2 - 1, bVar8) {
        uVar5 = source->width;
        for (lVar6 = 0; uVar5 >> 1 != (uint)lVar6; lVar6 = lVar6 + 1) {
          bVar7 = __src[lVar6];
          __dest[lVar6 * 2] = bVar7 >> 4;
          __dest[lVar6 * 2 + 1] = bVar7 & 0xf;
        }
        if ((source->width & 1) != 0) {
          __dest[lVar6 * 2] = __src[lVar6] >> 4;
        }
        __src = __src + source->pitch;
        __dest = __dest + target->pitch;
      }
      break;
    case '\a':
      target->num_grays = 0x100;
      uVar2 = source->rows;
      while (bVar8 = uVar2 != 0, uVar2 = uVar2 - 1, bVar8) {
        uVar5 = source->width;
        for (lVar6 = 0; uVar5 != (uint)lVar6; lVar6 = lVar6 + 1) {
          bVar7 = __src[lVar6 * 4 + 3];
          if (bVar7 == 0) {
            bVar7 = 0;
          }
          else {
            bVar7 = bVar7 - (char)(((uint)__src[lVar6 * 4 + 2] * (uint)__src[lVar6 * 4 + 2] * 0x3671
                                    + (uint)__src[lVar6 * 4 + 1] * (uint)__src[lVar6 * 4 + 1] *
                                      0xb714 + (uint)__src[lVar6 * 4] * (uint)__src[lVar6 * 4] *
                                               0x127b >> 0x10) / (uint)bVar7);
          }
          __dest[lVar6] = bVar7;
        }
        __src = __src + source->pitch;
        __dest = __dest + target->pitch;
      }
    }
  }
  return error;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Convert( FT_Library        library,
                     const FT_Bitmap  *source,
                     FT_Bitmap        *target,
                     FT_Int            alignment )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Memory  memory;

    FT_Byte*  s;
    FT_Byte*  t;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !source || !target )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    switch ( source->pixel_mode )
    {
    case FT_PIXEL_MODE_MONO:
    case FT_PIXEL_MODE_GRAY:
    case FT_PIXEL_MODE_GRAY2:
    case FT_PIXEL_MODE_GRAY4:
    case FT_PIXEL_MODE_LCD:
    case FT_PIXEL_MODE_LCD_V:
    case FT_PIXEL_MODE_BGRA:
      {
        FT_Int  width = (FT_Int)source->width;
        FT_Int  neg   = ( target->pitch == 0 && source->pitch < 0 ) ||
                          target->pitch  < 0;


        FT_Bitmap_Done( library, target );

        target->pixel_mode = FT_PIXEL_MODE_GRAY;
        target->rows       = source->rows;
        target->width      = source->width;

        if ( alignment )
        {
          FT_Int  rem = width % alignment;


          if ( rem )
            width = alignment > 0 ? width - rem + alignment
                                  : width - rem - alignment;
        }

        if ( FT_QALLOC_MULT( target->buffer, target->rows, width ) )
          return error;

        target->pitch = neg ? -width : width;
      }
      break;

    default:
      error = FT_THROW( Invalid_Argument );
    }

    s = source->buffer;
    t = target->buffer;

    /* take care of bitmap flow */
    if ( source->pitch < 0 )
      s -= source->pitch * (FT_Int)( source->rows - 1 );
    if ( target->pitch < 0 )
      t -= target->pitch * (FT_Int)( target->rows - 1 );

    switch ( source->pixel_mode )
    {
    case FT_PIXEL_MODE_MONO:
      {
        FT_UInt  i;


        target->num_grays = 2;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_Byte*  ss = s;
          FT_Byte*  tt = t;
          FT_UInt   j;


          /* get the full bytes */
          for ( j = source->width >> 3; j > 0; j-- )
          {
            FT_Int  val = ss[0]; /* avoid a byte->int cast on each line */


            tt[0] = (FT_Byte)( ( val & 0x80 ) >> 7 );
            tt[1] = (FT_Byte)( ( val & 0x40 ) >> 6 );
            tt[2] = (FT_Byte)( ( val & 0x20 ) >> 5 );
            tt[3] = (FT_Byte)( ( val & 0x10 ) >> 4 );
            tt[4] = (FT_Byte)( ( val & 0x08 ) >> 3 );
            tt[5] = (FT_Byte)( ( val & 0x04 ) >> 2 );
            tt[6] = (FT_Byte)( ( val & 0x02 ) >> 1 );
            tt[7] = (FT_Byte)(   val & 0x01 );

            tt += 8;
            ss += 1;
          }

          /* get remaining pixels (if any) */
          j = source->width & 7;
          if ( j > 0 )
          {
            FT_Int  val = *ss;


            for ( ; j > 0; j-- )
            {
              tt[0] = (FT_Byte)( ( val & 0x80 ) >> 7);
              val <<= 1;
              tt   += 1;
            }
          }

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;


    case FT_PIXEL_MODE_GRAY:
    case FT_PIXEL_MODE_LCD:
    case FT_PIXEL_MODE_LCD_V:
      {
        FT_UInt  width = source->width;
        FT_UInt  i;


        target->num_grays = 256;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_ARRAY_COPY( t, s, width );

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;


    case FT_PIXEL_MODE_GRAY2:
      {
        FT_UInt  i;


        target->num_grays = 4;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_Byte*  ss = s;
          FT_Byte*  tt = t;
          FT_UInt   j;


          /* get the full bytes */
          for ( j = source->width >> 2; j > 0; j-- )
          {
            FT_Int  val = ss[0];


            tt[0] = (FT_Byte)( ( val & 0xC0 ) >> 6 );
            tt[1] = (FT_Byte)( ( val & 0x30 ) >> 4 );
            tt[2] = (FT_Byte)( ( val & 0x0C ) >> 2 );
            tt[3] = (FT_Byte)( ( val & 0x03 ) );

            ss += 1;
            tt += 4;
          }

          j = source->width & 3;
          if ( j > 0 )
          {
            FT_Int  val = ss[0];


            for ( ; j > 0; j-- )
            {
              tt[0]  = (FT_Byte)( ( val & 0xC0 ) >> 6 );
              val  <<= 2;
              tt    += 1;
            }
          }

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;


    case FT_PIXEL_MODE_GRAY4:
      {
        FT_UInt  i;


        target->num_grays = 16;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_Byte*  ss = s;
          FT_Byte*  tt = t;
          FT_UInt   j;


          /* get the full bytes */
          for ( j = source->width >> 1; j > 0; j-- )
          {
            FT_Int  val = ss[0];


            tt[0] = (FT_Byte)( ( val & 0xF0 ) >> 4 );
            tt[1] = (FT_Byte)( ( val & 0x0F ) );

            ss += 1;
            tt += 2;
          }

          if ( source->width & 1 )
            tt[0] = (FT_Byte)( ( ss[0] & 0xF0 ) >> 4 );

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;


    case FT_PIXEL_MODE_BGRA:
      {
        FT_UInt  i;


        target->num_grays = 256;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_Byte*  ss = s;
          FT_Byte*  tt = t;
          FT_UInt   j;


          for ( j = source->width; j > 0; j-- )
          {
            tt[0] = ft_gray_for_premultiplied_srgb_bgra( ss );

            ss += 4;
            tt += 1;
          }

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;

    default:
      ;
    }

    return error;
  }